

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
__thiscall
duckdb::BaseReservoirSampling::Deserialize(BaseReservoirSampling *this,Deserializer *deserializer)

{
  pointer ppVar1;
  uint uVar2;
  int iVar3;
  BaseReservoirSampling *this_00;
  pointer pBVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer *__ptr;
  pointer ppVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  type local_48;
  idx_t iVar5;
  
  this_00 = (BaseReservoirSampling *)operator_new(0x78);
  BaseReservoirSampling(this_00);
  *(BaseReservoirSampling **)&(this->random).super_RandomEngine.lock.super___mutex_base._M_mutex =
       this_00;
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"next_index_to_sample");
  if ((char)uVar2 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar5 = CONCAT44(extraout_var,iVar3);
  }
  pBVar4->next_index_to_sample = iVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"min_weight_threshold");
  (*deserializer->_vptr_Deserializer[0x19])(deserializer);
  pBVar4->min_weight_threshold = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"min_weighted_entry_index");
  if ((char)uVar2 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar5 = CONCAT44(extraout_var_00,iVar3);
  }
  pBVar4->min_weighted_entry_index = iVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  uVar2 = (*deserializer->_vptr_Deserializer[4])
                    (deserializer,0x67,"num_entries_to_skip_b4_next_sample");
  if ((char)uVar2 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar5 = CONCAT44(extraout_var_01,iVar3);
  }
  pBVar4->num_entries_to_skip_b4_next_sample = iVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"num_entries_seen_total");
  if ((char)uVar2 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar5 = CONCAT44(extraout_var_02,iVar3);
  }
  pBVar4->num_entries_seen_total = iVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pBVar4 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x69,"reservoir_weights");
  if ((char)uVar2 == '\0') {
    ppVar6 = (pBVar4->reservoir_weights).c.
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pBVar4->reservoir_weights).c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar4->reservoir_weights).c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar4->reservoir_weights).c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Deserializer::
    Read<std::priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>>
              (&local_48,deserializer);
    ppVar1 = (pBVar4->reservoir_weights).c.
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (pBVar4->reservoir_weights).c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_48.c.
         super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pBVar4->reservoir_weights).c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_48.c.
         super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pBVar4->reservoir_weights).c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_48.c.
         super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.c.
    super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppVar6 = local_48.c.
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar1 != (pointer)0x0) {
      operator_delete(ppVar1);
      ppVar6 = local_48.c.
               super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  if (ppVar6 != (pointer)0x0) {
    operator_delete(ppVar6);
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  return (unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          )(unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
            )this;
}

Assistant:

unique_ptr<BaseReservoirSampling> BaseReservoirSampling::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BaseReservoirSampling>(new BaseReservoirSampling());
	deserializer.ReadPropertyWithDefault<idx_t>(100, "next_index_to_sample", result->next_index_to_sample);
	deserializer.ReadProperty<double>(101, "min_weight_threshold", result->min_weight_threshold);
	deserializer.ReadPropertyWithDefault<idx_t>(102, "min_weighted_entry_index", result->min_weighted_entry_index);
	deserializer.ReadPropertyWithDefault<idx_t>(103, "num_entries_to_skip_b4_next_sample", result->num_entries_to_skip_b4_next_sample);
	deserializer.ReadPropertyWithDefault<idx_t>(104, "num_entries_seen_total", result->num_entries_seen_total);
	deserializer.ReadPropertyWithDefault<std::priority_queue<std::pair<double, idx_t>>>(105, "reservoir_weights", result->reservoir_weights);
	return result;
}